

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

uint8_t * GetFramePayload(uint8_t *mem_buf,Frame *frame,size_t *data_size)

{
  ChunkData *pCVar1;
  long local_48;
  size_t inter_size;
  size_t start_offset;
  ChunkData *alpha;
  ChunkData *image;
  size_t *data_size_local;
  Frame *frame_local;
  uint8_t *mem_buf_local;
  uint8_t *local_8;
  
  *data_size = 0;
  if (frame == (Frame *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    pCVar1 = frame->img_components_;
    start_offset = pCVar1->offset_;
    *data_size = frame->img_components_[0].size_;
    if (frame->img_components_[1].size_ != 0) {
      if (pCVar1->offset_ == 0) {
        local_48 = 0;
      }
      else {
        local_48 = pCVar1->offset_ -
                   (frame->img_components_[1].offset_ + frame->img_components_[1].size_);
      }
      start_offset = frame->img_components_[1].offset_;
      *data_size = frame->img_components_[1].size_ + local_48 + *data_size;
    }
    local_8 = mem_buf + start_offset;
  }
  return local_8;
}

Assistant:

static const uint8_t* GetFramePayload(const uint8_t* const mem_buf,
                                      const Frame* const frame,
                                      size_t* const data_size) {
  *data_size = 0;
  if (frame != NULL) {
    const ChunkData* const image = frame->img_components_;
    const ChunkData* const alpha = frame->img_components_ + 1;
    size_t start_offset = image->offset_;
    *data_size = image->size_;

    // if alpha exists it precedes image, update the size allowing for
    // intervening chunks.
    if (alpha->size_ > 0) {
      const size_t inter_size = (image->offset_ > 0)
                              ? image->offset_ - (alpha->offset_ + alpha->size_)
                              : 0;
      start_offset = alpha->offset_;
      *data_size  += alpha->size_ + inter_size;
    }
    return mem_buf + start_offset;
  }
  return NULL;
}